

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

destructive_iterator * __thiscall
google::
sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
::destructive_begin(destructive_iterator *__return_storage_ptr__,
                   sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                   *this)

{
  destructive_iterator local_68;
  destructive_iterator local_48;
  
  sparsetable<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::destructive_begin(&local_48,&this->table);
  sparsetable<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::destructive_end(&local_68,&this->table);
  (__return_storage_ptr__->end).row_current._M_current = local_68.row_current._M_current;
  (__return_storage_ptr__->end).col_current = local_68.col_current;
  (__return_storage_ptr__->end).row_begin._M_current = local_68.row_begin._M_current;
  (__return_storage_ptr__->end).row_end._M_current = local_68.row_end._M_current;
  (__return_storage_ptr__->pos).row_begin._M_current = local_48.row_begin._M_current;
  (__return_storage_ptr__->pos).row_end._M_current = local_48.row_end._M_current;
  (__return_storage_ptr__->pos).row_current._M_current = local_48.row_current._M_current;
  (__return_storage_ptr__->pos).col_current = local_48.col_current;
  __return_storage_ptr__->ht = this;
  sparse_hashtable_destructive_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::advance_past_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

destructive_iterator destructive_begin() {
    return destructive_iterator(this, table.destructive_begin(),
                                table.destructive_end());
  }